

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void calc_frm_crc(MppFrame frame,FrmCrc *crc)

{
  ulong uVar1;
  RK_U32 len;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  RK_U8 *buf;
  RK_U32 stride;
  RK_U32 height;
  RK_U32 width;
  RK_U32 xor;
  RK_U32 *dat32;
  RK_U8 *dat8;
  RK_U32 x;
  RK_U32 y;
  RK_U32 grp_cnt;
  RK_U32 grp_line_cnt;
  RK_ULONG data_grp_byte_cnt;
  FrmCrc *crc_local;
  MppFrame frame_local;
  
  height = 0;
  len = mpp_frame_get_width(frame);
  uVar2 = mpp_frame_get_height(frame);
  iVar3 = mpp_frame_get_hor_stride(frame);
  uVar5 = mpp_frame_get_buffer(frame);
  lVar6 = mpp_buffer_get_ptr_with_caller(uVar5,"calc_frm_crc");
  uVar1 = 0x400000004 / (ulong)(len + 3 & 0xfffffffc);
  uVar4 = (uint)uVar1;
  (crc->luma).sum_cnt = ((uVar2 + uVar4) - 1) / uVar4;
  for (dat8._4_4_ = 0; dat8._4_4_ < (uVar2 / uVar4) * uVar4; dat8._4_4_ = dat8._4_4_ + 1) {
    wide_bit_sum((RK_U8 *)(lVar6 + (ulong)(dat8._4_4_ * iVar3)),len,
                 (crc->luma).sum + (ulong)dat8._4_4_ / (uVar1 & 0xffffffff));
  }
  if (uVar2 % uVar4 != 0) {
    for (dat8._4_4_ = (uVar2 / uVar4) * uVar4; dat8._4_4_ < uVar2; dat8._4_4_ = dat8._4_4_ + 1) {
      wide_bit_sum((RK_U8 *)(lVar6 + (ulong)(dat8._4_4_ * iVar3)),len,
                   (crc->luma).sum + (ulong)dat8._4_4_ / (uVar1 & 0xffffffff));
    }
  }
  for (dat8._4_4_ = 0; dat8._4_4_ < uVar2; dat8._4_4_ = dat8._4_4_ + 1) {
    for (dat8._0_4_ = 0; (uint)dat8 < len >> 2; dat8._0_4_ = (uint)dat8 + 1) {
      height = *(uint *)(lVar6 + (ulong)(dat8._4_4_ * iVar3) + (ulong)(uint)dat8 * 4) ^ height;
    }
  }
  (crc->luma).len = uVar2 * len;
  (crc->luma).vor = height;
  (crc->chroma).sum_cnt = (((uVar2 >> 1) + uVar4) - 1) / uVar4;
  lVar7 = lVar6 + (ulong)(uVar2 * iVar3);
  for (dat8._4_4_ = 0; dat8._4_4_ < ((uVar2 >> 1) / uVar4) * uVar4; dat8._4_4_ = dat8._4_4_ + 1) {
    wide_bit_sum((RK_U8 *)(lVar7 + (ulong)(dat8._4_4_ * iVar3)),len,
                 (crc->chroma).sum + (ulong)dat8._4_4_ / (uVar1 & 0xffffffff));
  }
  if ((uVar2 >> 1) % uVar4 != 0) {
    for (dat8._4_4_ = ((uVar2 >> 1) / uVar4) * uVar4; dat8._4_4_ < uVar2 >> 1;
        dat8._4_4_ = dat8._4_4_ + 1) {
      wide_bit_sum((RK_U8 *)(lVar7 + (ulong)(dat8._4_4_ * iVar3)),len,
                   (crc->chroma).sum + (ulong)dat8._4_4_ / (uVar1 & 0xffffffff));
    }
  }
  for (dat8._4_4_ = 0; dat8._4_4_ < uVar2 >> 1; dat8._4_4_ = dat8._4_4_ + 1) {
    for (dat8._0_4_ = 0; (uint)dat8 < len >> 2; dat8._0_4_ = (uint)dat8 + 1) {
      height = *(uint *)(lVar6 + (ulong)(uVar2 * iVar3) + (ulong)(dat8._4_4_ * iVar3) +
                        (ulong)(uint)dat8 * 4) ^ height;
    }
  }
  (crc->chroma).len = uVar2 * len >> 1;
  (crc->chroma).vor = height;
  return;
}

Assistant:

void calc_frm_crc(MppFrame frame, FrmCrc *crc)
{
    RK_ULONG data_grp_byte_cnt = MAX_HALF_WORD_SUM_CNT * CAL_BYTE;
    RK_U32 grp_line_cnt = 0;
    RK_U32 grp_cnt = 0;

    RK_U32 y = 0, x = 0;
    RK_U8 *dat8 = NULL;
    RK_U32 *dat32 = NULL;
    RK_U32 xor = 0;

    RK_U32 width  = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 stride = mpp_frame_get_hor_stride(frame);
    RK_U8 *buf = (RK_U8 *)mpp_buffer_get_ptr(mpp_frame_get_buffer(frame));

    grp_line_cnt = data_grp_byte_cnt / ((width + CAL_BYTE - 1) / CAL_BYTE * CAL_BYTE);

    /* luma */
    grp_cnt = (height + grp_line_cnt - 1) / grp_line_cnt;
    crc->luma.sum_cnt = grp_cnt;

    dat8 = buf;
    for (y = 0; y <  height / grp_line_cnt * grp_line_cnt; y++) {
        wide_bit_sum(&dat8[y * stride], width, &crc->luma.sum[y / grp_line_cnt]);
    }
    if (height % grp_line_cnt) {
        for (y = height / grp_line_cnt * grp_line_cnt; y < height; y++) {
            wide_bit_sum(&dat8[y * stride], width, &crc->luma.sum[y / grp_line_cnt]);
        }
    }

    dat8 = buf;
    for (y = 0; y < height; y++) {
        dat32 = (RK_U32 *)&dat8[y * stride];
        for (x = 0; x < width / 4; x++)
            xor ^= dat32[x];
    }
    crc->luma.len = height * width;
    crc->luma.vor = xor;

    /* chroma */
    grp_cnt = (height / 2 + grp_line_cnt - 1) / grp_line_cnt;
    crc->chroma.sum_cnt = grp_cnt;

    dat8 = buf + height * stride;
    for (y = 0; y <  height / 2 / grp_line_cnt * grp_line_cnt; y++) {
        wide_bit_sum(&dat8[y * stride], width, &crc->chroma.sum[y / grp_line_cnt]);
    }
    if (height / 2 % grp_line_cnt) {
        for (y = height / 2 / grp_line_cnt * grp_line_cnt; y < height / 2; y++) {
            wide_bit_sum(&dat8[y * stride], width, &crc->chroma.sum[y / grp_line_cnt]);
        }
    }

    dat8 = buf + height * stride;
    for (y = 0; y < height / 2; y++) {
        dat32 = (RK_U32 *)&dat8[y * stride];
        for (x = 0; x < width / 4; x++)
            xor ^= dat32[x];
    }
    crc->chroma.len = height * width / 2;
    crc->chroma.vor = xor;
}